

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlChar * xmlXPathCastToString(xmlXPathObjectPtr val)

{
  xmlChar *pxVar1;
  
  if (val != (xmlXPathObjectPtr)0x0) {
    switch(val->type) {
    case XPATH_UNDEFINED:
    case XPATH_USERS:
      break;
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
      pxVar1 = xmlXPathCastNodeSetToString(val->nodesetval);
      return pxVar1;
    case XPATH_BOOLEAN:
      if (val->boolval != 0) {
        pxVar1 = xmlStrdup((xmlChar *)"true");
        return pxVar1;
      }
      pxVar1 = xmlStrdup((xmlChar *)"false");
      return pxVar1;
    case XPATH_NUMBER:
      pxVar1 = xmlXPathCastNumberToString(val->floatval);
      return pxVar1;
    case XPATH_STRING:
      pxVar1 = xmlStrdup(val->stringval);
      return pxVar1;
    default:
      return (xmlChar *)0x0;
    }
  }
  pxVar1 = xmlStrdup("");
  return pxVar1;
}

Assistant:

xmlChar *
xmlXPathCastToString(xmlXPathObjectPtr val) {
    xmlChar *ret = NULL;

    if (val == NULL)
	return(xmlStrdup((const xmlChar *) ""));
    switch (val->type) {
	case XPATH_UNDEFINED:
	    ret = xmlStrdup((const xmlChar *) "");
	    break;
        case XPATH_NODESET:
        case XPATH_XSLT_TREE:
	    ret = xmlXPathCastNodeSetToString(val->nodesetval);
	    break;
	case XPATH_STRING:
	    return(xmlStrdup(val->stringval));
        case XPATH_BOOLEAN:
	    ret = xmlXPathCastBooleanToString(val->boolval);
	    break;
	case XPATH_NUMBER: {
	    ret = xmlXPathCastNumberToString(val->floatval);
	    break;
	}
	case XPATH_USERS:
	    /* TODO */
	    ret = xmlStrdup((const xmlChar *) "");
	    break;
    }
    return(ret);
}